

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O1

SharedNumberFormat * __thiscall
icu_63::LocaleCacheKey<icu_63::SharedNumberFormat>::createObject
          (LocaleCacheKey<icu_63::SharedNumberFormat> *this,void *param_1,UErrorCode *status)

{
  NumberFormat *pNVar1;
  SharedNumberFormat *this_00;
  size_t size;
  Locale LStack_f8;
  
  Locale::Locale(&LStack_f8,(this->fLoc).fullName,(char *)0x0,(char *)0x0,(char *)0x0);
  size = 1;
  pNVar1 = NumberFormat::internalCreateInstance(&LStack_f8,UNUM_DECIMAL,status);
  Locale::~Locale(&LStack_f8);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (SharedNumberFormat *)UMemory::operator_new((UMemory *)0x20,size);
    if (this_00 == (SharedNumberFormat *)0x0) {
      this_00 = (SharedNumberFormat *)0x0;
    }
    else {
      (this_00->super_SharedObject).softRefCount = 0;
      (this_00->super_SharedObject).hardRefCount = (__atomic_base<int>)0x0;
      (this_00->super_SharedObject).cachePtr = (UnifiedCacheBase *)0x0;
      (this_00->super_SharedObject).super_UObject._vptr_UObject =
           (_func_int **)&PTR__SharedNumberFormat_003b3088;
      this_00->ptr = pNVar1;
    }
    if (this_00 != (SharedNumberFormat *)0x0) {
      SharedObject::addRef(&this_00->super_SharedObject);
      return this_00;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
    if (pNVar1 != (NumberFormat *)0x0) {
      (*(pNVar1->super_Format).super_UObject._vptr_UObject[1])(pNVar1);
    }
  }
  return (SharedNumberFormat *)0x0;
}

Assistant:

U_I18N_API
const SharedNumberFormat *LocaleCacheKey<SharedNumberFormat>::createObject(
        const void * /*unused*/, UErrorCode &status) const {
    const char *localeId = fLoc.getName();
    NumberFormat *nf = NumberFormat::internalCreateInstance(
            localeId, UNUM_DECIMAL, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    SharedNumberFormat *result = new SharedNumberFormat(nf);
    if (result == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        delete nf;
        return NULL;
    }
    result->addRef();
    return result;
}